

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void processarg<main::__4>(string *arg,anon_class_64_4_986e26b8 *act,bool mustexist)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  anon_class_64_4_986e26b8 local_270;
  anon_class_64_4_986e26b8 local_230;
  __4 local_1e8 [64];
  anon_class_72_2_e81b5cd9 local_1a8;
  string local_158 [32];
  undefined1 local_138 [8];
  MmapReader rl;
  undefined1 local_68 [8];
  string srcname;
  string romname;
  size_t ieq;
  bool mustexist_local;
  anon_class_64_4_986e26b8 *act_local;
  string *arg_local;
  
  lVar2 = std::__cxx11::string::find((char)arg,0x3d);
  if (lVar2 == -1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)arg);
    if (*pcVar3 == '@') {
      std::__cxx11::string::substr((ulong)local_158,(ulong)arg);
      MmapReader::MmapReader((MmapReader *)local_138,local_158);
      std::__cxx11::string::~string(local_158);
      main::$_4::__4((__4 *)&local_1a8,act);
      local_1a8.mustexist = mustexist;
      MmapReader::
      line_enumerator<processarg<main::__4>(std::__cxx11::string_const&,main::__4,bool)::_lambda(char_const*,char_const*)_1_>
                ((MmapReader *)local_138,&local_1a8);
      processarg<main::$_4>(std::__cxx11::string_const&,main::$_4,bool)::
      {lambda(char_const*,char_const*)#1}::~basic_string
                ((_lambda_char_const__char_const___1_ *)&local_1a8);
      MmapReader::~MmapReader((MmapReader *)local_138);
    }
    else {
      iVar1 = GetFileInfo<char>(arg);
      if (iVar1 == 2) {
        main::$_4::__4(local_1e8,act);
        dir_iterator<processarg<main::__4>(std::__cxx11::string_const&,main::__4,bool)::_lambda(std::__cxx11::string_const&)_1_,processarg<main::__4>(std::__cxx11::string_const&,main::__4,bool)::_lambda(std::__cxx11::string_const&)_2_>
                  (arg,local_1e8);
        processarg<main::$_4>(std::__cxx11::string_const&,main::$_4,bool)::
        {lambda(std::__cxx11::string_const&)#1}::~basic_string
                  ((_lambda_std____cxx11__string_const___1_ *)local_1e8);
      }
      else if (iVar1 == 3) {
        main::$_4::__4((__4 *)&local_230,act);
        handlepath<main::__4>(arg,&local_230);
        main::$_4::~__4((__4 *)&local_230);
      }
      else if (mustexist) {
        uVar4 = std::__cxx11::string::c_str();
        printf("WARNING: %s does not exist\n",uVar4);
      }
      else {
        main::$_4::__4((__4 *)&local_270,act);
        handlepath<main::__4>(arg,&local_270);
        main::$_4::~__4((__4 *)&local_270);
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&srcname.field_2 + 8),(ulong)arg);
    std::__cxx11::string::substr((ulong)local_68,(ulong)arg);
    main::anon_class_64_4_986e26b8::operator()
              (act,(string *)local_68,(string *)((long)&srcname.field_2 + 8));
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(srcname.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void processarg(const std::string& arg, ACTION act, bool mustexist)
{
    size_t ieq= arg.find('=');
    if (ieq!=std::string::npos) {
        //  <rom>=<src>
        std::string romname= arg.substr(0,ieq);
        std::string srcname= arg.substr(ieq+1);
        act(srcname, romname);
    }
    else if (arg[0]=='@') {
        // if name starts with '@' -> read list from file
        MmapReader rl(arg.substr(1), MmapReader::readonly);

        rl.line_enumerator([act,mustexist](const char *first, const char*last)->bool {
            processarg(std::string(first, last-first), act, mustexist);
            return true;
        });
    }
    else switch (GetFileInfo(arg)) {
        case AT_ISDIRECTORY:
            // if <arg> is a directory -> add all files in that directory
            dir_iterator(arg, [act](const std::string& srcpath) {
                    handlepath(srcpath, act);
                },
                [](const std::string& dirname)->bool { printf("NOTE: not processing subdirectory %s\n", dirname.c_str()); return false; }
            );
            break;
        case AT_ISFILE:
            handlepath(arg, act);
            break;
        default:
            if (mustexist)
                printf("WARNING: %s does not exist\n", arg.c_str());
            else
                handlepath(arg, act);
    }
}